

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O1

int recvsimplehtml(SOCKET sock,char **pTitle,char **pBody,int maxrecvbuflen,int *pBytesReceived)

{
  int iVar1;
  char *contenttype;
  char *szstatus;
  char *titleparams;
  char *content;
  char *bodyparams;
  int contentlength;
  int status;
  
  status = 0;
  szstatus = (char *)0x0;
  contenttype = (char *)0x0;
  contentlength = 0;
  content = (char *)0x0;
  titleparams = (char *)0x0;
  bodyparams = (char *)0x0;
  *pTitle = (char *)0x0;
  *pBody = (char *)0x0;
  iVar1 = recvsimplehttpresp(sock,&status,&szstatus,&contenttype,&contentlength,&content,
                             maxrecvbuflen,pBytesReceived);
  if (iVar1 == 0) {
    iVar1 = strncmp(contenttype,"text/html",9);
    if (iVar1 == 0) {
      iVar1 = gethtmltagdata(content,"title",&titleparams,pTitle);
      if (iVar1 == 0) {
        iVar1 = gethtmltagdata(content,"body",&bodyparams,pBody);
        if (iVar1 == 0) {
          free(bodyparams);
          free(titleparams);
          free(szstatus);
          free(contenttype);
          iVar1 = 0;
          goto LAB_00166e7c;
        }
        free(titleparams);
      }
      free(szstatus);
      free(contenttype);
      iVar1 = 1;
    }
    else {
      free(szstatus);
      free(contenttype);
      iVar1 = 4;
    }
  }
  else {
    free(szstatus);
    free(contenttype);
  }
LAB_00166e7c:
  free(content);
  return iVar1;
}

Assistant:

inline int recvsimplehtml(SOCKET sock, char** pTitle, char** pBody, int maxrecvbuflen, int* pBytesReceived)
{
	int status = 0;
	char* szstatus = NULL;
	char* contenttype = NULL;
	int contentlength = 0;
	char* content = NULL;
	int ret = 0;
	char* titleparams = NULL;
	char* bodyparams = NULL;

	*pTitle = NULL;
	*pBody = NULL;

	ret = recvsimplehttpresp(sock, &status, &szstatus, &contenttype, &contentlength, &content, maxrecvbuflen, pBytesReceived);
	if (ret != EXIT_SUCCESS)
	{
		free(szstatus);
		free(contenttype);
		free(content);
		return ret;
	}

	if (strncmp(contenttype, "text/html", strlen("text/html")) != 0)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehtml error (%s) : %s"
			"(sock=%d, title=%s, body=%s, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pTitle, *pBody, maxrecvbuflen, *pBytesReceived));
		free(szstatus);
		free(contenttype);
		free(content);
		return EXIT_INVALID_DATA;
	}

	if (gethtmltagdata(content, "title", &titleparams, pTitle) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehtml error (%s) : %s"
			"(sock=%d, title=%s, body=%s, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_FAILURE],
			(int)sock, *pTitle, *pBody, maxrecvbuflen, *pBytesReceived));
		free(szstatus);
		free(contenttype);
		free(content);
		return EXIT_FAILURE;
	}

	if (gethtmltagdata(content, "body", &bodyparams, pBody) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehtml error (%s) : %s"
			"(sock=%d, title=%s, body=%s, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_FAILURE],
			(int)sock, *pTitle, *pBody, maxrecvbuflen, *pBytesReceived));
		free(titleparams);
		free(szstatus);
		free(contenttype);
		free(content);
		return EXIT_FAILURE;
	}

	free(bodyparams);
	free(titleparams);

	free(szstatus);
	free(contenttype);
	free(content);
	
	return EXIT_SUCCESS;
}